

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O2

void bill_dummy_object(obj *otmp)

{
  uint uVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  monst *shkp;
  obj *obj;
  long lVar7;
  obj *poVar8;
  obj *poVar9;
  byte bVar10;
  
  bVar10 = 0;
  if ((otmp->field_0x4a & 4) != 0) {
    shkp = shop_keeper(level,u.ushops[0]);
    subfrombill(otmp,shkp);
  }
  sVar3 = otmp->oxlth;
  iVar6 = (int)sVar3;
  bVar2 = otmp->onamelth;
  obj = (obj *)malloc((ulong)(iVar6 + (uint)bVar2) + 0x68);
  poVar8 = otmp;
  poVar9 = obj;
  for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
    poVar9->nobj = poVar8->nobj;
    poVar8 = (obj *)((long)poVar8 + (ulong)bVar10 * -0x10 + 8);
    poVar9 = (obj *)((long)poVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  obj->where = '\0';
  uVar4 = flags.ident;
  uVar1 = flags.ident + 1;
  uVar5 = uVar1;
  obj->o_id = flags.ident;
  flags.ident = uVar5;
  if (uVar4 == 0) {
    flags.ident = 2;
    obj->o_id = uVar1;
  }
  obj->timed = '\0';
  if (sVar3 != 0) {
    memcpy(obj->oextra,otmp->oextra,(long)iVar6);
  }
  if ((ulong)bVar2 != 0) {
    strncpy((char *)((long)obj->oextra + (long)obj->oxlth),
            (char *)((long)otmp->oextra + (long)iVar6),(ulong)bVar2);
  }
  if ((ushort)(obj->otyp - 0xe5U) < 2) {
    obj->field_0x4c = obj->field_0x4c & 0xf7;
  }
  addtobill(obj,'\0','\x01','\x01');
  *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffff3 | 8;
  return;
}

Assistant:

void bill_dummy_object(struct obj *otmp)
{
	struct obj *dummy;

	if (otmp->unpaid)
	    subfrombill(otmp, shop_keeper(level, *u.ushops));
	dummy = newobj(otmp->oxlth + otmp->onamelth);
	*dummy = *otmp;
	dummy->where = OBJ_FREE;
	dummy->o_id = flags.ident++;
	if (!dummy->o_id) dummy->o_id = flags.ident++;	/* ident overflowed */
	dummy->timed = 0;
	if (otmp->oxlth)
	    memcpy(dummy->oextra,
			otmp->oextra, otmp->oxlth);
	if (otmp->onamelth)
	    strncpy(ONAME(dummy), ONAME(otmp), (int)otmp->onamelth);
	if (Is_candle(dummy)) dummy->lamplit = 0;
	addtobill(dummy, FALSE, TRUE, TRUE);
	otmp->no_charge = 1;
	otmp->unpaid = 0;
	return;
}